

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::SingleVertexArrayNormalizeTests::init
          (SingleVertexArrayNormalizeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  Storage storage_;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  GLValue GVar2;
  GLValue GVar3;
  undefined1 local_100 [8];
  string name;
  undefined1 local_d0 [8];
  Spec spec;
  undefined4 uStack_94;
  undefined1 local_88 [8];
  ArraySpec arraySpec;
  int local_40;
  int countNdx;
  int componentCount;
  int storageNdx;
  int inputTypeNdx;
  int counts [2];
  Storage storages [1];
  InputType inputTypes [6];
  SingleVertexArrayNormalizeTests *this_local;
  
  stack0xffffffffffffffd8 = 0x400000000;
  memset(counts,0,4);
  _storageNdx = 0x10000000001;
  componentCount = 0;
  iVar1 = 1;
  while (componentCount < 6) {
    for (countNdx = 0; countNdx < 1; countNdx = countNdx + 1) {
      for (local_40 = 2; local_40 < 5; local_40 = local_40 + 1) {
        for (arraySpec.max.field_1._4_4_ = 0; (int)arraySpec.max.field_1._4_4_ < 2;
            arraySpec.max.field_1._4_4_ = arraySpec.max.field_1._4_4_ + 1) {
          type = counts[(long)componentCount + 1];
          storage_ = counts[countNdx];
          GVar2 = deqp::gls::GLValue::getMinValue(type);
          GVar3 = deqp::gls::GLValue::getMaxValue(counts[(long)componentCount + 1]);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar3.type;
          max_._4_4_ = spec.arrays.
                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          max_.type = (InputType)
                      spec.arrays.
                      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          min_._4_4_ = uStack_94;
          min_.type = GVar2.type;
          min_.field_1 = GVar2.field_1;
          max_.field_1 = GVar3.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_88,type,OUTPUTTYPE_VEC4,storage_,USAGE_DYNAMIC_DRAW,local_40
                     ,0,0,true,min_,max_);
          deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_d0);
          local_d0._0_4_ = PRIMITIVE_TRIANGLES;
          local_d0._4_4_ = (&storageNdx)[(int)arraySpec.max.field_1._4_4_];
          spec.primitive = PRIMITIVE_POINTS;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       *)&spec.first,(ArraySpec *)local_88);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_
                    ((string *)local_100,(Spec *)local_d0);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          renderCtx = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
          name_00 = (char *)std::__cxx11::string::c_str();
          desc = (char *)std::__cxx11::string::c_str();
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,testCtx,renderCtx,(Spec *)local_d0,name_00,desc);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          std::__cxx11::string::~string((string *)local_100);
          deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_d0);
        }
      }
    }
    componentCount = componentCount + 1;
    iVar1 = componentCount;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayNormalizeTests::init (void)
{
	// Test normalization with different input types, component counts and storage
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
		{
			for (int componentCount = 2; componentCount < 5; componentCount++)
			{
				for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
				{
					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	0,
																	true,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}